

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O0

bool __thiscall
despot::Logger::SummarizeStep
          (Logger *this,int step,int round,bool terminal,ACT_TYPE action,OBS_TYPE obs,
          double step_start_t)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  void *pvVar4;
  log_ostream *plVar5;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double dVar6;
  double dVar7;
  double local_50;
  double delta;
  double step_time;
  double step_end_t;
  double step_start_t_local;
  OBS_TYPE obs_local;
  ACT_TYPE action_local;
  bool terminal_local;
  int round_local;
  int step_local;
  Logger *this_local;
  
  poVar3 = std::operator<<(this->out_,"-----------------------------------Round ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,round);
  poVar3 = std::operator<<(poVar3," Step ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,step);
  poVar3 = std::operator<<(poVar3,"-----------------------------------");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  if (((DAT_00278ac0 & 1) == 0) && (this->out_ != (ostream *)0x0)) {
    std::operator<<(this->out_,"- Action = ");
    (*this->model_->_vptr_DSPOMDP[0x13])(this->model_,(ulong)(uint)action,this->out_);
  }
  iVar2 = (*this->world_->_vptr_World[4])();
  this->state_ = (State *)CONCAT44(extraout_var,iVar2);
  if (((this->state_ != (State *)0x0) && ((DAT_00278ac0 & 1) == 0)) &&
     (this->out_ != (ostream *)0x0)) {
    std::operator<<(this->out_,"- State:\n");
    (*this->model_->_vptr_DSPOMDP[0x11])(this->model_,this->state_,this->out_);
  }
  if ((((DAT_00278ac0 & 1) == 0) && (this->out_ != (ostream *)0x0)) &&
     (this->state_ != (State *)0x0)) {
    std::operator<<(this->out_,"- Observation = ");
    (*this->model_->_vptr_DSPOMDP[0x12])(this->model_,this->state_,obs,this->out_);
  }
  if (((this->state_ != (State *)0x0) && ((DAT_00278ac0 & 1) == 0)) &&
     (this->out_ != (ostream *)0x0)) {
    poVar3 = std::operator<<(this->out_,"- ObsProb = ");
    (*this->model_->_vptr_DSPOMDP[7])(this->model_,obs,this->state_,(ulong)(uint)action);
    pvVar4 = (void *)std::ostream::operator<<(poVar3,extraout_XMM0_Qa);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  }
  bVar1 = std::operator==(&this->world_type_,"pomdp");
  if (bVar1) {
    this->reward_ = (double)this->world_[2]._vptr_World;
  }
  else if (this->state_ != (State *)0x0) {
    (*this->model_->_vptr_DSPOMDP[6])(this->model_,this->state_,(ulong)(uint)action);
    this->reward_ = extraout_XMM0_Qa_00;
    dVar6 = this->reward_;
    (*this->model_->_vptr_DSPOMDP[10])();
    if (extraout_XMM0_Qa_01 < dVar6) {
      this->reward_ = 0.0;
      iVar2 = logging::level();
      if ((0 < iVar2) && (iVar2 = logging::level(), 3 < iVar2)) {
        plVar5 = logging::stream(4);
        poVar3 = std::operator<<(&plVar5->super_ostream,
                                 "[Logger::SummarizeStep] Reward function has not been defined in DSPOMDP model"
                                );
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
    }
  }
  dVar6 = Globals::Discount(this->step_);
  this->total_discounted_reward_ = dVar6 * this->reward_ + this->total_discounted_reward_;
  this->total_undiscounted_reward_ = this->reward_ + this->total_undiscounted_reward_;
  dVar6 = get_time_second();
  dVar6 = dVar6 - step_start_t;
  if (terminal) {
    iVar2 = logging::level();
    if ((0 < iVar2) && (iVar2 = logging::level(), 2 < iVar2)) {
      plVar5 = logging::stream(3);
      poVar3 = std::operator<<(&plVar5->super_ostream,
                               "[RunStep] Time for step: actual / allocated = ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar6);
      poVar3 = std::operator<<(poVar3," / ");
      pvVar4 = (void *)std::ostream::operator<<(poVar3,EvalLog::allocated_time);
      std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    }
    if (((DAT_00278ac0 & 1) == 0) && (this->out_ != (ostream *)0x0)) {
      std::ostream::operator<<(this->out_,std::endl<char,std::char_traits<char>>);
    }
    this->step_ = this->step_ + 1;
    this_local._7_1_ = true;
  }
  else {
    std::ostream::operator<<(this->out_,std::endl<char,std::char_traits<char>>);
    this->step_ = this->step_ + 1;
    iVar2 = logging::level();
    if ((0 < iVar2) && (iVar2 = logging::level(), 2 < iVar2)) {
      plVar5 = logging::stream(3);
      poVar3 = std::operator<<(&plVar5->super_ostream,"[main] Time for step: actual / allocated = ")
      ;
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar6);
      poVar3 = std::operator<<(poVar3," / ");
      pvVar4 = (void *)std::ostream::operator<<(poVar3,EvalLog::allocated_time);
      std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    }
    if (((DAT_00278ac0 & 1) == 0) && (this->out_ != (ostream *)0x0)) {
      poVar3 = std::operator<<(this->out_,"- Reward = ");
      pvVar4 = (void *)std::ostream::operator<<(poVar3,this->reward_);
      poVar3 = (ostream *)std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<(poVar3,"- Current rewards:");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<(poVar3,"  discounted / undiscounted = ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->total_discounted_reward_);
      poVar3 = std::operator<<(poVar3," / ");
      pvVar4 = (void *)std::ostream::operator<<(poVar3,this->total_undiscounted_reward_);
      std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    }
    if ((this->target_finish_time_ != -1.0) || (NAN(this->target_finish_time_))) {
      if (EvalLog::allocated_time * 0.99 <= dVar6) {
        if (EvalLog::allocated_time < dVar6) {
          local_50 = (dVar6 - EvalLog::allocated_time) / (EvalLog::allocated_time + 1e-06);
          if (local_50 < 0.02) {
            local_50 = 0.02;
          }
          if (0.05 < local_50) {
            local_50 = 0.05;
          }
          EvalLog::plan_time_ratio = EvalLog::plan_time_ratio - local_50;
        }
      }
      else {
        if (EvalLog::plan_time_ratio < 1.0) {
          EvalLog::plan_time_ratio = EvalLog::plan_time_ratio + 0.01;
        }
        if (1.0 < EvalLog::plan_time_ratio) {
          EvalLog::plan_time_ratio = 1.0;
        }
      }
      dVar6 = this->target_finish_time_;
      dVar7 = get_time_second();
      EvalLog::curr_inst_remaining_budget = dVar6 - dVar7;
      EvalLog::curr_inst_remaining_steps = EvalLog::curr_inst_remaining_steps + -1;
      if (EvalLog::curr_inst_remaining_steps < 1) {
        EvalLog::allocated_time = 0.0;
      }
      else {
        EvalLog::allocated_time =
             (EvalLog::curr_inst_remaining_budget - 2.0) /
             (double)EvalLog::curr_inst_remaining_steps;
        if (5.0 < EvalLog::allocated_time) {
          EvalLog::allocated_time = 5.0;
        }
      }
      Globals::config = EvalLog::plan_time_ratio * EvalLog::allocated_time;
    }
    iVar2 = logging::level();
    if ((0 < iVar2) && (iVar2 = logging::level(), 2 < iVar2)) {
      plVar5 = logging::stream(3);
      poVar3 = std::operator<<(&plVar5->super_ostream,"[main] Time per move set to ");
      pvVar4 = (void *)std::ostream::operator<<(poVar3,Globals::config);
      std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    }
    iVar2 = logging::level();
    if ((0 < iVar2) && (iVar2 = logging::level(), 2 < iVar2)) {
      plVar5 = logging::stream(3);
      poVar3 = std::operator<<(&plVar5->super_ostream,"[main] Plan time ratio set to ");
      pvVar4 = (void *)std::ostream::operator<<(poVar3,EvalLog::plan_time_ratio);
      std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Logger::SummarizeStep(int step, int round, bool terminal, ACT_TYPE action,
		OBS_TYPE obs, double step_start_t) {

	//Output step results
	*out_ << "-----------------------------------Round " << round << " Step "
			<< step << "-----------------------------------" << endl;
	if (!Globals::config.silence && out_) {
		*out_ << "- Action = ";
		model_->PrintAction(action, *out_);
	}

	state_ = world_->GetCurrentState();

	if (state_ != NULL) {
		if (!Globals::config.silence && out_) {
			*out_ << "- State:\n";
			model_->PrintState(*state_, *out_);
		}
	}

	if (!Globals::config.silence && out_ && state_ != NULL) {
		*out_ << "- Observation = ";
		model_->PrintObs(*state_, obs, *out_);
	}

	if (state_ != NULL) {
		if (!Globals::config.silence && out_)
			*out_ << "- ObsProb = " << model_->ObsProb(obs, *state_, action)
					<< endl;
	}

	//Record step reward
	if (world_type_ == "pomdp")
		reward_ = static_cast<POMDPWorld*>(world_)->step_reward_;
	else if (state_ != NULL) {
		reward_ = model_->Reward(*state_, action);
		if (reward_ > model_->GetMaxReward()) { //invalid reward from model_->Reward
			reward_ = 0;
			logd
					<< "[Logger::SummarizeStep] Reward function has not been defined in DSPOMDP model"
					<< endl;
		}
	}
	total_discounted_reward_ += Globals::Discount(step_) * reward_;
	total_undiscounted_reward_ += reward_;

	//Report step time
	double step_end_t = get_time_second();
	double step_time = (step_end_t - step_start_t);
	if (terminal) {
		logi << "[RunStep] Time for step: actual / allocated = " << step_time
				<< " / " << EvalLog::allocated_time << endl;
		if (!Globals::config.silence && out_)
			*out_ << endl;
		step_++;
		return true;
	}
	*out_ << endl;
	step_++;

	//Record time per move

	logi << "[main] Time for step: actual / allocated = " << step_time << " / "
			<< EvalLog::allocated_time << endl;

	if (!Globals::config.silence && out_)
		*out_ << "- Reward = " << reward_ << endl << "- Current rewards:"
				<< endl << "  discounted / undiscounted = "
				<< total_discounted_reward_ << " / "
				<< total_undiscounted_reward_ << endl;

	if (target_finish_time_ != -1) {
		if (step_time < 0.99 * EvalLog::allocated_time) {
			if (EvalLog::plan_time_ratio < 1.0)
				EvalLog::plan_time_ratio += 0.01;
			if (EvalLog::plan_time_ratio > 1.0)
				EvalLog::plan_time_ratio = 1.0;
		} else if (step_time > EvalLog::allocated_time) {
			double delta = (step_time - EvalLog::allocated_time)
					/ (EvalLog::allocated_time + 1E-6);
			if (delta < 0.02)
				delta = 0.02; // Minimum reduction per step
			if (delta > 0.05)
				delta = 0.05; // Maximum reduction per step
			EvalLog::plan_time_ratio -= delta;
			// if (EvalLog::plan_time_ratio < 0)
			// EvalLog::plan_time_ratio = 0;
		}

		EvalLog::curr_inst_remaining_budget = target_finish_time_
				- get_time_second();
		EvalLog::curr_inst_remaining_steps--;

		if (EvalLog::curr_inst_remaining_steps <= 0) {
			EvalLog::allocated_time = 0;
		} else {
			EvalLog::allocated_time =
					(EvalLog::curr_inst_remaining_budget - 2.0)
							/ EvalLog::curr_inst_remaining_steps;

			if (EvalLog::allocated_time > 5.0)
				EvalLog::allocated_time = 5.0;
		}

		Globals::config.time_per_move = EvalLog::plan_time_ratio
				* EvalLog::allocated_time;
	}
	logi << "[main] Time per move set to " << Globals::config.time_per_move
			<< endl;
	logi << "[main] Plan time ratio set to " << EvalLog::plan_time_ratio
			<< endl;

	return false;
}